

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

void __thiscall duckdb::MinMaxStringState::Assign(MinMaxStringState *this,string_t input)

{
  bool bVar1;
  idx_t __n;
  idx_t iVar2;
  char *__src;
  char *in_RDX;
  undefined8 in_RSI;
  string_t *in_RDI;
  char *ptr;
  idx_t len;
  MinMaxStringState *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffc8;
  string_t *in_stack_ffffffffffffffd0;
  string_t *local_28;
  anon_union_16_2_67f50693_for_value local_10;
  
  local_10._0_8_ = in_RSI;
  local_10.pointer.ptr = in_RDX;
  bVar1 = string_t::IsInlined((string_t *)0xf95d17);
  if (!bVar1) {
    __n = string_t::GetSize((string_t *)&local_10.pointer);
    if (((undefined1  [16])((undefined1  [16])in_RDI[1].value & (undefined1  [16])0x1) ==
         (undefined1  [16])0x0) || (iVar2 = string_t::GetSize(in_RDI), iVar2 < __n)) {
      Destroy(in_stack_ffffffffffffffb0);
      local_28 = (string_t *)operator_new__(__n);
    }
    else {
      local_28 = (string_t *)string_t::GetDataWriteable((string_t *)in_stack_ffffffffffffffb0);
    }
    __src = string_t::GetData(local_28);
    memcpy(local_28,__src,__n);
    UnsafeNumericCast<unsigned_int,unsigned_long,void>(__n);
    string_t::string_t(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                       (uint32_t)((ulong)in_RDI >> 0x20));
    *(char **)&in_RDI->value = in_stack_ffffffffffffffc8;
    (in_RDI->value).pointer.ptr = (char *)in_stack_ffffffffffffffd0;
    return;
  }
  Destroy(in_stack_ffffffffffffffb0);
  *(undefined8 *)&in_RDI->value = local_10._0_8_;
  (in_RDI->value).pointer.ptr = local_10.pointer.ptr;
  return;
}

Assistant:

void Assign(string_t input) {
		if (input.IsInlined()) {
			// inlined string - we can directly store it into the string_t without having to allocate anything
			Destroy();
			value = input;
		} else {
			// non-inlined string, need to allocate space for it somehow
			auto len = input.GetSize();
			char *ptr;
			if (!isset || value.GetSize() < len) {
				// we cannot fit this into the current slot - destroy it and re-allocate
				Destroy();
				ptr = new char[len];
			} else {
				// this fits into the current slot - take over the pointer
				ptr = value.GetDataWriteable();
			}
			memcpy(ptr, input.GetData(), len);

			value = string_t(ptr, UnsafeNumericCast<uint32_t>(len));
		}
	}